

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O1

bool XmlRpc::XmlRpcUtil::nextTagIs(char *tag,string *xml,int *offset)

{
  char cVar1;
  int iVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  char *__s1;
  bool bVar8;
  
  iVar2 = *offset;
  lVar7 = 0;
  if (iVar2 < (int)xml->_M_string_length) {
    pcVar3 = (xml->_M_dataplus)._M_p;
    cVar1 = pcVar3[iVar2];
    __s1 = pcVar3 + iVar2;
    bVar8 = cVar1 == '\0';
    if (!bVar8) {
      iVar5 = isspace((int)cVar1);
      if (iVar5 != 0) {
        lVar4 = 1;
        do {
          lVar7 = lVar4;
          bVar8 = __s1[lVar7] == '\0';
          if (bVar8) break;
          iVar5 = isspace((int)__s1[lVar7]);
          lVar4 = lVar7 + 1;
        } while (iVar5 != 0);
        __s1 = __s1 + lVar7;
      }
    }
    sVar6 = strlen(tag);
    if (!bVar8) {
      iVar5 = strncmp(__s1,tag,(long)(int)sVar6);
      if (iVar5 == 0) {
        *offset = (int)lVar7 + (int)sVar6 + iVar2;
        lVar7 = 1;
        goto LAB_0024eabe;
      }
    }
    lVar7 = 0;
  }
LAB_0024eabe:
  return SUB81(lVar7,0);
}

Assistant:

bool 
XmlRpcUtil::nextTagIs(const char* tag, std::string const& xml, int* offset)
{
  if (*offset >= int(xml.length())) return false;
  const char* cp = xml.c_str() + *offset;
  int nc = 0;
  while (*cp && isspace(*cp)) {
    ++cp;
    ++nc;
  }

  int len = int(strlen(tag));
  if  (*cp && (strncmp(cp, tag, len) == 0)) {
    *offset += nc + len;
    return true;
  }
  return false;
}